

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactor<double>::solveLleftForest
          (CLUFactor<double> *this,double eps,double *vec,int *nonz,int n)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  double *pdVar10;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int m;
  int *lbeg;
  int *lrow;
  int *lidx;
  int *idx;
  double *lval;
  double *val;
  double y;
  double x;
  int end;
  int k;
  int j;
  int i;
  double in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  int *local_60;
  double *local_50;
  int local_2c;
  int local_28;
  int local_24;
  
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x2613b3);
  lVar6 = *(long *)(in_RDI + 0x78);
  lVar7 = *(long *)(in_RDI + 0x98);
  lVar8 = *(long *)(in_RDI + 0x90);
  iVar3 = *(int *)(in_RDI + 0x84);
  local_24 = in_ECX;
  local_28 = *(int *)(in_RDI + 0x88);
  while (iVar5 = local_28, local_28 = iVar5 + -1, iVar3 <= local_28) {
    dVar1 = *(double *)(in_RSI + (long)*(int *)(lVar7 + (long)local_28 * 4) * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      iVar4 = *(int *)(lVar8 + (long)local_28 * 4);
      local_50 = pdVar10 + iVar4;
      local_60 = (int *)(lVar6 + (long)iVar4 * 4);
      for (local_2c = *(int *)(lVar8 + (long)iVar5 * 4); iVar4 < local_2c; local_2c = local_2c + -1)
      {
        iVar5 = *local_60;
        dVar2 = *(double *)(in_RSI + (long)iVar5 * 8);
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          in_stack_ffffffffffffff70 = dVar2 - dVar1 * *local_50;
          if ((in_stack_ffffffffffffff70 == 0.0) && (!NAN(in_stack_ffffffffffffff70))) {
            in_stack_ffffffffffffff70 = 1e-100;
          }
          *(double *)(in_RSI + (long)iVar5 * 8) = in_stack_ffffffffffffff70;
        }
        else {
          dVar2 = *local_50;
          bVar9 = isNotZero<double,double>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          if (bVar9) {
            *(double *)(in_RSI + (long)iVar5 * 8) = -dVar1 * dVar2;
            *(int *)(in_RDX + (long)local_24 * 4) = iVar5;
            local_24 = local_24 + 1;
          }
        }
        local_50 = local_50 + 1;
        local_60 = local_60 + 1;
      }
    }
  }
  return local_24;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R x, y;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      assert(i >= 0 && i < l.size);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  nonz[n++] = m;
               }
            }
            else
            {
               y -= x * (*val++);
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}